

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

Time helics::findNextTriggerEvent(TimeDependencies *deps)

{
  bool bVar1;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  Time me;
  TimeDependencies *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_20 [3];
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = 0x7fffffffffffffff;
  local_20[0]._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_ffffffffffffffc8);
  TimeDependencies::end(in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
         ::operator*(local_20);
    if (((in_stack_ffffffffffffffd0->nonGranting & 1U) == 0) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&(in_stack_ffffffffffffffd0->super_TimeData).Te,&local_8), bVar1)) {
      local_8.internalTimeCode = (in_stack_ffffffffffffffd0->super_TimeData).Te.internalTimeCode;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_20);
  }
  return (Time)local_8.internalTimeCode;
}

Assistant:

static Time findNextTriggerEvent(const TimeDependencies& deps)
{
    Time me{Time::maxVal()};
    for (const auto& dep : deps) {
        if (!dep.nonGranting) {
            if (dep.Te < me) {
                me = dep.Te;
            }
        }
    }
    return me;
}